

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gz_init(gz_state *state)

{
  uint uVar1;
  int32_t iVar2;
  uchar *puVar3;
  uchar *puVar4;
  
  uVar1 = state->want;
  puVar3 = (uchar *)aligned_alloc(0x40);
  state->in = puVar3;
  if (puVar3 != (uchar *)0x0) {
    memset(puVar3,0,(ulong)(uVar1 * 2));
    if (state->direct != 0) {
LAB_0011c0ed:
      state->size = state->want;
      if (state->direct != 0) {
        return 0;
      }
      (state->strm).avail_out = state->want;
      puVar3 = state->out;
      (state->strm).next_out = puVar3;
      (state->x).next = puVar3;
      return 0;
    }
    puVar4 = (uchar *)aligned_alloc(0x40,(ulong)uVar1 + 0x3f & 0x1ffffffc0);
    state->out = puVar4;
    if (puVar4 != (uchar *)0x0) {
      (state->strm).zalloc = (alloc_func)0x0;
      (state->strm).zfree = (free_func)0x0;
      (state->strm).opaque = (void *)0x0;
      iVar2 = zng_deflateInit2(&state->strm,state->level,8,0x1f,8,state->strategy);
      if (iVar2 == 0) {
        (state->strm).next_in = (uint8_t *)0x0;
        goto LAB_0011c0ed;
      }
      free(state->out);
      puVar3 = state->in;
    }
    free(puVar3);
  }
  gz_error(state,-4,"out of memory");
  return -1;
}

Assistant:

static int gz_init(gz_state *state) {
    int ret;
    PREFIX3(stream) *strm = &(state->strm);

    /* allocate input buffer (double size for gzprintf) */
    state->in = (unsigned char *)zng_alloc(state->want << 1);
    if (state->in == NULL) {
        gz_error(state, Z_MEM_ERROR, "out of memory");
        return -1;
    }
    memset(state->in, 0, state->want << 1);

    /* only need output buffer and deflate state if compressing */
    if (!state->direct) {
        /* allocate output buffer */
        state->out = (unsigned char *)zng_alloc(state->want);
        if (state->out == NULL) {
            zng_free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }

        /* allocate deflate memory, set up for gzip compression */
        strm->zalloc = NULL;
        strm->zfree = NULL;
        strm->opaque = NULL;
        ret = PREFIX(deflateInit2)(strm, state->level, Z_DEFLATED, MAX_WBITS + 16, DEF_MEM_LEVEL, state->strategy);
        if (ret != Z_OK) {
            zng_free(state->out);
            zng_free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        strm->next_in = NULL;
    }

    /* mark state as initialized */
    state->size = state->want;

    /* initialize write buffer if compressing */
    if (!state->direct) {
        strm->avail_out = state->size;
        strm->next_out = state->out;
        state->x.next = strm->next_out;
    }
    return 0;
}